

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O2

void hgdb::json::SymbolTable::walk_up<true>
               (ScopeBase *scope,function<bool_(hgdb::json::ScopeBase_*)> *terminate)

{
  pointer puVar1;
  ScopeBase *scope_00;
  bool bVar2;
  __normal_iterator<const_std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>_*,_std::vector<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>,_std::allocator<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>_>_>_>
  __tmp;
  pointer puVar3;
  uint64_t uVar4;
  
  scope_00 = scope->parent;
  if (scope_00 != (ScopeBase *)0x0) {
    puVar3 = (scope->scopes_).
             super__Vector_base<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>,_std::allocator<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    do {
      if (puVar3 == (scope->scopes_).
                    super__Vector_base<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>,_std::allocator<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) {
        uVar4 = scope->index_;
        do {
          bVar2 = uVar4 == 0;
          uVar4 = uVar4 - 1;
          if (bVar2) {
            walk_up<false>(scope_00,terminate);
            return;
          }
          bVar2 = std::function<bool_(hgdb::json::ScopeBase_*)>::operator()
                            (terminate,
                             (ScopeBase *)
                             (scope_00->scopes_).
                             super__Vector_base<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>,_std::allocator<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar4]._M_t.
                             super___uniq_ptr_impl<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>
                             ._M_t);
        } while (!bVar2);
        return;
      }
      puVar1 = puVar3 + -1;
      puVar3 = puVar3 + -1;
      bVar2 = std::function<bool_(hgdb::json::ScopeBase_*)>::operator()
                        (terminate,
                         (puVar1->_M_t).
                         super___uniq_ptr_impl<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_hgdb::json::ScopeBase_*,_std::default_delete<hgdb::json::ScopeBase>_>
                         .super__Head_base<0UL,_hgdb::json::ScopeBase_*,_false>._M_head_impl);
    } while (!bVar2);
  }
  return;
}

Assistant:

static void walk_up(ScopeBase *scope, const std::function<bool(ScopeBase *)> &terminate) {
        auto *parent = scope->parent;
        if (!parent) return;
        if constexpr (include_current) {
            // NOLINTNEXTLINE
            for (auto child = scope->rbegin(); child != scope->rend(); child++) {
                auto res = terminate(child->get());
                if (res) return;
            }
        }

        for (auto i = scope->index_; i > 0; i--) {
            auto &s = parent->operator[](i - 1);
            auto res = terminate(&s);
            if (res) return;
        }
        walk_up<false>(parent, terminate);
    }